

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O0

Vec_Ptr_t * Abc_NtkDfsReverse(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Ptr_t *vNodes_00;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pNode;
  int local_30;
  int local_2c;
  int k;
  int i;
  Abc_Obj_t *pFanout;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  Abc_Ntk_t *pNtk_local;
  
  Abc_NtkIncrementTravId(pNtk);
  vNodes_00 = Vec_PtrAlloc(100);
  for (local_2c = 0; iVar1 = Abc_NtkCiNum(pNtk), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar2 = Abc_NtkCi(pNtk,local_2c);
    Abc_NodeSetTravIdCurrent(pAVar2);
    pAVar2 = Abc_ObjFanout0Ntk(pAVar2);
    for (local_30 = 0; iVar1 = Abc_ObjFanoutNum(pAVar2), local_30 < iVar1; local_30 = local_30 + 1)
    {
      pNode = Abc_ObjFanout(pAVar2,local_30);
      Abc_NtkDfsReverse_rec(pNode,vNodes_00);
    }
  }
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    for (local_2c = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_2c < iVar1; local_2c = local_2c + 1)
    {
      pAVar2 = Abc_NtkObj(pNtk,local_2c);
      if (((pAVar2 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar2), iVar1 != 0)) &&
         (iVar1 = Abc_NodeIsConst(pAVar2), iVar1 != 0)) {
        Vec_PtrPush(vNodes_00,pAVar2);
      }
    }
  }
  return vNodes_00;
}

Assistant:

Vec_Ptr_t * Abc_NtkDfsReverse( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj, * pFanout;
    int i, k;
    // set the traversal ID
    Abc_NtkIncrementTravId( pNtk );
    // start the array of nodes
    vNodes = Vec_PtrAlloc( 100 );
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        Abc_NodeSetTravIdCurrent( pObj );
        pObj = Abc_ObjFanout0Ntk(pObj);
        Abc_ObjForEachFanout( pObj, pFanout, k )
            Abc_NtkDfsReverse_rec( pFanout, vNodes );
    }
    // add constant nodes in the end
    if ( !Abc_NtkIsStrash(pNtk) ) {
        Abc_NtkForEachNode( pNtk, pObj, i )
            if ( Abc_NodeIsConst(pObj) )
                Vec_PtrPush( vNodes, pObj );
    }
    return vNodes;
}